

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O2

MPP_RET parse_prepare_avcC_header(H264dInputCtx_t *p_Inp,H264dCurCtx_t *p_Cur)

{
  RK_U8 *pRVar1;
  MppPacket pvVar2;
  RK_U8 *ptr;
  uint uVar3;
  MPP_RET MVar4;
  undefined8 uVar5;
  int iVar6;
  ushort *puVar7;
  
  pRVar1 = p_Inp->in_buf;
  pvVar2 = p_Inp->in_pkt;
  ptr = (p_Cur->strm).nalu_buf;
  if (ptr != (RK_U8 *)0x0) {
    mpp_osal_free("parse_prepare_avcC_header",ptr);
  }
  (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
  if (p_Inp->in_length < 7) {
    MVar4 = MPP_ERR_UNKNOW;
    if (((byte)h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_parse","avcC too short, len=%d \n",(char *)0x0);
    }
  }
  else if (*pRVar1 == '\x01') {
    p_Inp->profile = pRVar1[1];
    p_Inp->level = pRVar1[3];
    p_Inp->nal_size = (pRVar1[4] & 3) + 1;
    uVar3 = pRVar1[5] & 0x1f;
    p_Inp->sps_num = uVar3;
    puVar7 = (ushort *)(pRVar1 + 6);
    for (iVar6 = 0; iVar6 < (int)uVar3; iVar6 = iVar6 + 1) {
      (p_Cur->strm).nalu_len = (uint)(ushort)(*puVar7 << 8 | *puVar7 >> 8);
      (p_Cur->strm).nalu_type = 7;
      (p_Cur->strm).nalu_buf = (RK_U8 *)(puVar7 + 1);
      MVar4 = store_cur_nalu(p_Cur,&p_Cur->strm,p_Cur->p_Dec->dxva_ctx);
      if (MVar4 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar4;
        }
        uVar5 = 0x35d;
        goto LAB_00186f19;
      }
      puVar7 = (ushort *)((long)(puVar7 + 1) + (ulong)(p_Cur->strm).nalu_len);
      uVar3 = p_Inp->sps_num;
    }
    (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
    uVar3 = (uint)(byte)*puVar7;
    p_Inp->pps_num = (uint)(byte)*puVar7;
    puVar7 = (ushort *)((long)puVar7 + 1);
    for (iVar6 = 0; iVar6 < (int)uVar3; iVar6 = iVar6 + 1) {
      (p_Cur->strm).nalu_len = (uint)(ushort)(*puVar7 << 8 | *puVar7 >> 8);
      (p_Cur->strm).nalu_type = 8;
      (p_Cur->strm).nalu_buf = (RK_U8 *)(puVar7 + 1);
      MVar4 = store_cur_nalu(p_Cur,&p_Cur->strm,p_Cur->p_Dec->dxva_ctx);
      if (MVar4 < MPP_OK) {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar4;
        }
        uVar5 = 0x368;
LAB_00186f19:
        _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,uVar5);
        return MVar4;
      }
      puVar7 = (ushort *)((long)(puVar7 + 1) + (ulong)(p_Cur->strm).nalu_len);
      uVar3 = p_Inp->pps_num;
    }
    *(undefined8 *)((long)pvVar2 + 0x20) = 0;
    (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
    (p_Cur->strm).startcode_found = '\x01';
    MVar4 = MPP_OK;
  }
  else {
    MVar4 = MPP_ERR_UNKNOW;
  }
  return MVar4;
}

Assistant:

MPP_RET parse_prepare_avcC_header(H264dInputCtx_t *p_Inp, H264dCurCtx_t *p_Cur)
{
    RK_S32 i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;

    H264dCurStream_t *p_strm = &p_Cur->strm;
    RK_U8 *pdata = p_Inp->in_buf;
    MppPacketImpl *pkt_impl  = (MppPacketImpl *)p_Inp->in_pkt;

    //!< free nalu_buffer
    MPP_FREE(p_strm->nalu_buf);
    if (p_Inp->in_length < 7) {
        H264D_ERR("avcC too short, len=%d \n", p_Inp->in_length);
        goto __FAILED;
    }
    if (pdata[0] != 1) {
        goto __FAILED;
    }
    p_Inp->profile = pdata[1];
    p_Inp->level = pdata[3];
    p_Inp->nal_size = 1 + (pdata[4] & 3);
    p_Inp->sps_num = pdata[5] & 31;

    pdata += 6;
    for (i = 0; i < p_Inp->sps_num; ++i) {
        p_strm->nalu_len = U16_AT(pdata);
        pdata += 2;
        p_strm->nalu_type = H264_NALU_TYPE_SPS;
        p_strm->nalu_buf = pdata;
        FUN_CHECK(ret = store_cur_nalu(p_Cur, p_strm, p_Cur->p_Dec->dxva_ctx));
        pdata += p_strm->nalu_len;
    }
    p_strm->nalu_buf = NULL;
    p_Inp->pps_num = *pdata;
    ++pdata;
    for (i = 0; i < p_Inp->pps_num; ++i) {
        p_strm->nalu_len = U16_AT(pdata);
        pdata += 2;
        p_strm->nalu_type = H264_NALU_TYPE_PPS;
        p_strm->nalu_buf = pdata;
        FUN_CHECK(ret = store_cur_nalu(p_Cur, p_strm, p_Cur->p_Dec->dxva_ctx));
        pdata += p_strm->nalu_len;
    }
    pkt_impl->length = 0;
    p_strm->nalu_buf = NULL;
    p_strm->startcode_found = 1;

    ret = MPP_OK;
__FAILED:
    return ret;
}